

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void open_file_endpoint(connection *conn,char *path,file_stat_t *st,char *extra_headers)

{
  uint *puVar1;
  uint uVar2;
  int64_t iVar3;
  int iVar4;
  char *pcVar5;
  tm *ptVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  int64_t r1;
  ulong local_550;
  mg_connection *local_548;
  char *local_540;
  int64_t r2;
  time_t curtime;
  vec mime_vec;
  char range [64];
  char etag [64];
  char lm [64];
  char date [64];
  char headers [1000];
  
  local_540 = extra_headers;
  curtime = time((time_t *)0x0);
  conn->endpoint_type = EP_FILE;
  fcntl64((conn->endpoint).fd,2,1);
  (conn->mg_conn).status_code = 200;
  get_mime_type(conn->server,path,&mime_vec);
  conn->cl = st->st_size;
  range[0] = '\0';
  r2 = 0;
  r1 = 0;
  local_548 = &conn->mg_conn;
  pcVar5 = mg_get_header(&conn->mg_conn,"Range");
  pcVar9 = "OK";
  if (pcVar5 != (char *)0x0) {
    iVar4 = __isoc99_sscanf(pcVar5,"bytes=%ld-%ld",&r1,&r2);
    if (-1 < r2 && (-1 < r1 && 0 < iVar4)) {
      (conn->mg_conn).status_code = 0xce;
      lVar7 = conn->cl;
      if (iVar4 == 2) {
        if (r2 < lVar7) {
          lVar7 = r2;
        }
        lVar7 = (lVar7 - r1) + 1;
      }
      else {
        lVar7 = lVar7 - r1;
      }
      conn->cl = lVar7;
      mg_snprintf(range,0x40,"Content-Range: bytes %ld-%ld/%ld\r\n",r1,r1 + lVar7 + -1,st->st_size);
      lseek64((conn->endpoint).fd,r1,0);
      pcVar9 = "Partial Content";
    }
  }
  ptVar6 = gmtime(&curtime);
  strftime(date,0x40,"%a, %d %b %Y %H:%M:%S GMT",ptVar6);
  ptVar6 = gmtime(&st->st_mtime);
  strftime(lm,0x40,"%a, %d %b %Y %H:%M:%S GMT",ptVar6);
  mg_snprintf(etag,0x40,"\"%lx.%ld\"",st->st_mtime,st->st_size);
  uVar2 = (conn->mg_conn).status_code;
  local_550 = (ulong)(uint)mime_vec.len;
  iVar3 = conn->cl;
  iVar4 = should_keep_alive(local_548);
  pcVar5 = "keep-alive";
  if (iVar4 == 0) {
    pcVar5 = "close";
  }
  pcVar8 = local_540;
  if (local_540 == (char *)0x0) {
    pcVar8 = "";
  }
  iVar4 = mg_snprintf(headers,1000,
                      "HTTP/1.1 %d %s\r\nDate: %s\r\nLast-Modified: %s\r\nEtag: %s\r\nContent-Type: %.*s\r\nContent-Length: %ld\r\nConnection: %s\r\nAccept-Ranges: bytes\r\n%s%s%s\r\n"
                      ,(ulong)uVar2,pcVar9,date,lm,etag,local_550,mime_vec.ptr,iVar3,pcVar5,range,
                      pcVar8,"");
  ns_out(conn->ns_conn,headers,(long)iVar4);
  iVar4 = strcmp((conn->mg_conn).request_method,"HEAD");
  if (iVar4 == 0) {
    puVar1 = &conn->ns_conn->flags;
    *puVar1 = *puVar1 | 1;
    close((conn->endpoint).fd);
    conn->endpoint_type = EP_NONE;
  }
  return;
}

Assistant:

static void open_file_endpoint(struct connection *conn, const char *path,
                               file_stat_t *st, const char *extra_headers) {
  char date[64], lm[64], etag[64], range[64], headers[1000];
  const char *msg = "OK", *hdr;
  time_t curtime = time(NULL);
  int64_t r1, r2;
  struct vec mime_vec;
  int n;

  conn->endpoint_type = EP_FILE;
  ns_set_close_on_exec(conn->endpoint.fd);
  conn->mg_conn.status_code = 200;

  get_mime_type(conn->server, path, &mime_vec);
  conn->cl = st->st_size;
  range[0] = '\0';

  // If Range: header specified, act accordingly
  r1 = r2 = 0;
  hdr = mg_get_header(&conn->mg_conn, "Range");
  if (hdr != NULL && (n = parse_range_header(hdr, &r1, &r2)) > 0 &&
      r1 >= 0 && r2 >= 0) {
    conn->mg_conn.status_code = 206;
    conn->cl = n == 2 ? (r2 > conn->cl ? conn->cl : r2) - r1 + 1: conn->cl - r1;
    mg_snprintf(range, sizeof(range), "Content-Range: bytes "
                "%" INT64_FMT "-%" INT64_FMT "/%" INT64_FMT "\r\n",
                r1, r1 + conn->cl - 1, (int64_t) st->st_size);
    msg = "Partial Content";
    lseek(conn->endpoint.fd, r1, SEEK_SET);
  }

  // Prepare Etag, Date, Last-Modified headers. Must be in UTC, according to
  // http://www.w3.org/Protocols/rfc2616/rfc2616-sec3.html#sec3.3
  gmt_time_string(date, sizeof(date), &curtime);
  gmt_time_string(lm, sizeof(lm), &st->st_mtime);
  construct_etag(etag, sizeof(etag), st);

  n = mg_snprintf(headers, sizeof(headers),
                  "HTTP/1.1 %d %s\r\n"
                  "Date: %s\r\n"
                  "Last-Modified: %s\r\n"
                  "Etag: %s\r\n"
                  "Content-Type: %.*s\r\n"
                  "Content-Length: %" INT64_FMT "\r\n"
                  "Connection: %s\r\n"
                  "Accept-Ranges: bytes\r\n"
                  "%s%s%s\r\n",
                  conn->mg_conn.status_code, msg, date, lm, etag,
                  (int) mime_vec.len, mime_vec.ptr, conn->cl,
                  suggest_connection_header(&conn->mg_conn),
                  range, extra_headers == NULL ? "" : extra_headers,
                  MONGOOSE_USE_EXTRA_HTTP_HEADERS);
  ns_send(conn->ns_conn, headers, n);

  if (!strcmp(conn->mg_conn.request_method, "HEAD")) {
    conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    close(conn->endpoint.fd);
    conn->endpoint_type = EP_NONE;
  }
}